

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvc.c
# Opt level: O0

err_t cvcExtr(int argc,char **argv)

{
  char *name;
  int in_EDI;
  btok_cvc_t *cvc;
  octet *cert;
  void *stack;
  size_t cert_len;
  err_t code;
  size_t in_stack_00000038;
  octet *in_stack_00000040;
  size_t in_stack_00000048;
  octet *in_stack_00000050;
  btok_cvc_t *in_stack_00000058;
  size_t in_stack_ffffffffffffffc8;
  char **in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint in_stack_ffffffffffffffe8;
  err_t local_4;
  
  if (in_EDI == 2) {
    local_4 = cmdFileValExist(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (((local_4 == 0) &&
        (local_4 = cmdFileValNotExist(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8),
        local_4 == 0)) &&
       (local_4 = cmdFileReadAll((void *)(ulong)in_stack_ffffffffffffffe8,
                                 (size_t *)
                                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                 (char *)in_stack_ffffffffffffffd8), local_4 == 0)) {
      name = (char *)blobCreate(in_stack_ffffffffffffffc8);
      local_4 = 0x6e;
      if (name != (char *)0x0) {
        local_4 = 0;
      }
      if (local_4 == 0) {
        local_4 = cmdFileReadAll((void *)(ulong)in_stack_ffffffffffffffe8,
                                 (size_t *)
                                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),name)
        ;
        if (local_4 == 0) {
          local_4 = btokCVCUnwrap(in_stack_00000058,in_stack_00000050,in_stack_00000048,
                                  in_stack_00000040,in_stack_00000038);
          if (local_4 == 0) {
            local_4 = cmdFileWrite((char *)(ulong)in_stack_ffffffffffffffe8,
                                   (void *)CONCAT44(in_stack_ffffffffffffffe4,
                                                    in_stack_ffffffffffffffe0),(size_t)name);
            blobClose((blob_t)0x10f997);
          }
          else {
            blobClose((blob_t)0x10f95e);
          }
        }
        else {
          blobClose((blob_t)0x10f924);
        }
      }
    }
  }
  else {
    local_4 = 0x25b;
  }
  return local_4;
}

Assistant:

static err_t cvcExtr(int argc, char* argv[])
{
	err_t code;
	size_t cert_len;
	void* stack;
	octet* cert;
	btok_cvc_t* cvc;
	// обработать опции
	if (argc != 2)
		return ERR_CMD_PARAMS;
	// проверить наличие/отсутствие файлов
	code = cmdFileValExist(1, argv);
	ERR_CALL_CHECK(code);
	code = cmdFileValNotExist(1, argv + 1);
	ERR_CALL_CHECK(code);
	// определить длину сертификата
	code = cmdFileReadAll(0, &cert_len, argv[0]);
	ERR_CALL_CHECK(code);
	// выделить память и разметить ее
	code = cmdBlobCreate(stack, cert_len + sizeof(btok_cvc_t));
	ERR_CALL_CHECK(code);
	cert = (octet*)stack;
	cvc = (btok_cvc_t*)(cert + cert_len);
	// прочитать сертификат
	code = cmdFileReadAll(cert, &cert_len, argv[0]);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// разобрать сертификат
	code = btokCVCUnwrap(cvc, cert, cert_len, 0, 0);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// сохранить открытый ключ
	code = cmdFileWrite(argv[1], cvc->pubkey, cvc->pubkey_len);
	// завершить
	cmdBlobClose(stack);
	return code;
}